

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<9,_10,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 uVar1;
  int i;
  undefined1 *puVar2;
  undefined8 *puVar3;
  long lVar4;
  undefined4 *puVar5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  bool bVar10;
  undefined4 uVar11;
  float afStack_98 [6];
  float local_80 [2];
  Vector<float,_3> res_1;
  Vector<float,_3> res;
  undefined8 local_58;
  undefined4 local_50;
  undefined8 local_48;
  undefined4 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined1 local_28 [4];
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined8 local_18;
  float afStack_10 [4];
  long lVar9;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    puVar2 = local_28;
    lVar4 = 0;
    lVar6 = 0;
    do {
      lVar7 = 0;
      auVar8 = _DAT_00ac4b30;
      do {
        bVar10 = SUB164(auVar8 ^ _DAT_00ac4b80,4) == -0x80000000 &&
                 SUB164(auVar8 ^ _DAT_00ac4b80,0) < -0x7ffffffd;
        if (bVar10) {
          uVar11 = 0x3f800000;
          if (lVar4 != lVar7) {
            uVar11 = 0;
          }
          *(undefined4 *)(puVar2 + lVar7 + -0x10) = uVar11;
        }
        if (bVar10) {
          uVar11 = 0x3f800000;
          if (lVar4 + -0x10 != lVar7) {
            uVar11 = 0;
          }
          *(undefined4 *)(puVar2 + lVar7) = uVar11;
        }
        lVar9 = auVar8._8_8_;
        auVar8._0_8_ = auVar8._0_8_ + 2;
        auVar8._8_8_ = lVar9 + 2;
        lVar7 = lVar7 + 0x20;
      } while (lVar7 != 0x40);
      lVar6 = lVar6 + 1;
      lVar4 = lVar4 + 0x10;
      puVar2 = puVar2 + 4;
    } while (lVar6 != 4);
    local_38 = *(undefined8 *)evalCtx->in[0].m_data;
    uStack_30._0_4_ = (undefined4)*(undefined8 *)(evalCtx->in[0].m_data + 2);
    uVar1 = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    uStack_24 = (undefined4)((ulong)*(undefined8 *)evalCtx->in[1].m_data >> 0x20);
    uStack_20 = (undefined4)uVar1;
    uStack_1c = (undefined4)((ulong)uVar1 >> 0x20);
    local_18._0_4_ = (float)*(undefined8 *)evalCtx->in[2].m_data;
    afStack_10._0_8_ = *(undefined8 *)(evalCtx->in[2].m_data + 2);
  }
  else {
    puVar3 = &local_38;
    local_18 = 0;
    afStack_10[0] = 0.0;
    afStack_10[1] = 0.0;
    uStack_24 = 0;
    uStack_20 = 0;
    uStack_1c = 0;
    local_38 = 0;
    uStack_30 = 0;
    puVar5 = &sr::(anonymous_namespace)::s_constInMat3x4;
    lVar4 = 0;
    do {
      lVar6 = 0;
      do {
        *(undefined4 *)((long)puVar3 + lVar6 * 4) = *(undefined4 *)((long)puVar5 + lVar6);
        lVar6 = lVar6 + 4;
      } while (lVar6 != 0xc);
      lVar4 = lVar4 + 1;
      puVar3 = (undefined8 *)((long)puVar3 + 4);
      puVar5 = puVar5 + 3;
    } while (lVar4 != 4);
  }
  local_48 = local_38;
  local_40 = (undefined4)uStack_30;
  local_58 = CONCAT44(uStack_20,uStack_24);
  local_50 = uStack_1c;
  local_80[0] = 0.0;
  local_80[1] = 0.0;
  res_1.m_data._0_8_ = res_1.m_data._0_8_ & 0xffffffff00000000;
  lVar4 = 0;
  do {
    res_1.m_data[lVar4 + -2] =
         *(float *)((long)&local_48 + lVar4 * 4) + *(float *)((long)&local_58 + lVar4 * 4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  res.m_data[0] = afStack_10[0];
  res.m_data[1] = afStack_10[1];
  res.m_data[2] = (float)local_18;
  afStack_98[2] = 0.0;
  afStack_98[3] = 0.0;
  afStack_98[4] = 0.0;
  lVar4 = 0;
  do {
    afStack_98[lVar4 + 2] = res_1.m_data[lVar4 + -2] + res.m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 1.4013e-45;
  res_1.m_data[2] = 2.8026e-45;
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[(int)res_1.m_data[lVar4 + -2]] = afStack_98[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(in0);
	}